

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppjit.hpp
# Opt level: O1

void __thiscall
cppjit::kernel<void,_cppjit::detail::pack<>_>::operator()
          (kernel<void,_cppjit::detail::pack<>_> *this)

{
  _func_void *in_RAX;
  _func_void *fp;
  _func_void *local_18;
  
  local_18 = in_RAX;
  if ((this->kernel_implementation).super__Function_base._M_manager == (_Manager_type)0x0) {
    local_18 = (_func_void *)
               builder::builder::compile
                         ((this->builder).
                          super___shared_ptr<cppjit::builder::builder,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
    std::function<void()>::operator=((function<void()> *)&this->kernel_implementation,&local_18);
  }
  if ((this->kernel_implementation).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->kernel_implementation)._M_invoker)((_Any_data *)&this->kernel_implementation);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

R operator()(Args... args) {
    if (!kernel_implementation) {
      this->compile();
      // throw cppjit::cppjit_exception("kernel not compiled");
    }
    return kernel_implementation(std::forward<Args>(args)...);
  }